

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O1

bool test_std_supports_SJIS_codecvt(string *locale_name)

{
  int iVar1;
  bool bVar2;
  wstring cmp;
  wstring ref;
  ofstream f;
  wchar_t *local_278;
  size_t local_270;
  wchar_t local_268 [4];
  locale local_258 [8];
  wchar_t *local_250;
  size_t local_248;
  wchar_t local_240 [4];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [280];
  
  std::ofstream::ofstream((ostream *)&local_230,"test-siftjis.txt",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,anon_var_dwarf_7227,4);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  std::wfstream::wfstream(&local_230);
  std::locale::locale((locale *)&local_278,(locale_name->_M_dataplus)._M_p);
  std::wios::imbue(local_258);
  std::locale::~locale(local_258);
  std::locale::~locale((locale *)&local_278);
  std::wfstream::open((char *)&local_230,0x1143a1);
  local_278 = local_268;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_278,L"日本",L"");
  local_248 = 0;
  local_240[0] = L'\0';
  local_250 = local_240;
  std::operator>>((wistream *)&local_230,(wstring *)&local_250);
  if (local_248 == local_270) {
    if (local_248 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = wmemcmp(local_250,local_278,local_248);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  std::wfstream::~wfstream(&local_230);
  remove("test-siftjis.txt");
  return bVar2;
}

Assistant:

inline bool test_std_supports_SJIS_codecvt(std::string const &locale_name)
{
    bool res = true;
    {
    // Japan in Shift JIS/cp932
        char const *japan_932 = "\x93\xfa\x96\x7b";
        std::ofstream f("test-siftjis.txt");
        f<<japan_932;
        f.close();		
    }
    try {
        std::wfstream test;
        test.imbue(std::locale(locale_name.c_str()));
        test.open("test-siftjis.txt");
        // Japan in Unicode
        std::wstring cmp = L"\u65e5\u672c";
        std::wstring ref;
        test >> ref;
        res = ref == cmp;
    }
    catch(std::exception const &)
    {
        res = false;
    }
    remove("test-siftjis.txt");
    return res;
}